

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O1

void __thiscall
t_rb_generator::generate_rb_struct
          (t_rb_generator *this,t_rb_ofstream *out,t_struct *tstruct,bool is_exception)

{
  ostream *poVar1;
  t_rb_generator *ptVar2;
  int iVar3;
  string local_50;
  
  generate_rdoc(this,out,(t_doc *)tstruct);
  if (0 < *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   field_0xf8) {
    iVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar3 = iVar3 + 1;
    } while (iVar3 < *(int *)&(out->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  ptVar2 = (t_rb_generator *)0x399c84;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"class ",6);
  type_name_abi_cxx11_(&local_50,ptVar2,&tstruct->super_t_type);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  ptVar2 = (t_rb_generator *)out;
  if (is_exception) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out," < ::Thrift::Exception",0x16)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
    ;
    iVar3 = *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                     field_0xf8;
    *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8 =
         iVar3 + 1;
    if (-1 < iVar3) {
      iVar3 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
        iVar3 = iVar3 + 1;
      } while (iVar3 < *(int *)&(out->super_ofstream).
                                super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,"include ::Thrift::Struct, ::Thrift::Struct_Union",0x30);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
    ;
    generate_rb_simple_exception_constructor(ptVar2,out,tstruct);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
    ;
    iVar3 = *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                     field_0xf8;
    *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8 =
         iVar3 + 1;
    if (-1 < iVar3) {
      iVar3 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
        iVar3 = iVar3 + 1;
      } while (iVar3 < *(int *)&(out->super_ofstream).
                                super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,"include ::Thrift::Struct, ::Thrift::Struct_Union",0x30);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
    ;
  }
  generate_field_constants(ptVar2,out,tstruct);
  generate_field_defns(this,out,tstruct);
  generate_rb_struct_required_validator(this,out,tstruct);
  if (0 < *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   field_0xf8) {
    iVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar3 = iVar3 + 1;
    } while (iVar3 < *(int *)&(out->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"::Thrift::Struct.generate_accessors self",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  iVar3 = *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   field_0xf8;
  *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8 =
       iVar3 + -1;
  if (1 < iVar3) {
    iVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar3 = iVar3 + 1;
    } while (iVar3 < *(int *)&(out->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"end",3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_rb_generator::generate_rb_struct(t_rb_ofstream& out,
                                        t_struct* tstruct,
                                        bool is_exception = false) {
  generate_rdoc(out, tstruct);
  out.indent() << "class " << type_name(tstruct);
  if (is_exception) {
    out << " < ::Thrift::Exception";
  }
  out << endl;

  out.indent_up();
  out.indent() << "include ::Thrift::Struct, ::Thrift::Struct_Union" << endl;

  if (is_exception) {
    generate_rb_simple_exception_constructor(out, tstruct);
  }

  generate_field_constants(out, tstruct);
  generate_field_defns(out, tstruct);
  generate_rb_struct_required_validator(out, tstruct);

  out.indent() << "::Thrift::Struct.generate_accessors self" << endl;

  out.indent_down();
  out.indent() << "end" << endl << endl;
}